

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O3

int __thiscall
CumulativeCalProp::getStartTimeForEndTime(CumulativeCalProp *this,int i,int end,int duration)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (this->taskCalendar).data[(uint)i];
  iVar3 = end - duration;
  iVar2 = this->minTime;
  if (iVar2 <= iVar3) {
    do {
      iVar4 = this->workingPeriods[(long)iVar1 + -1][iVar3] -
              this->workingPeriods[(long)iVar1 + -1][end];
      iVar3 = (iVar4 - duration) + iVar3;
      if (duration <= iVar4) break;
    } while (iVar2 <= iVar3);
  }
  if (iVar3 < iVar2) {
    iVar3 = (this->workingPeriods[iVar1 + -1][iVar2] + iVar2) -
            (duration + this->workingPeriods[iVar1 + -1][end]);
  }
  return iVar3;
}

Assistant:

int getStartTimeForEndTime(const int i, const int end, const int duration) {
		const int cal_idx = taskCalendar[i] - 1;
		int start = end - duration;
		if (start >= minTime) {
			int workDays;
			do {
				workDays = workingPeriods[cal_idx][start] - workingPeriods[cal_idx][end];
				start -= duration - workDays;
			} while (workDays < duration && start >= minTime);
			assert(workDays == duration || start < minTime);
		}
		if (start < minTime) {
			start =
					minTime - duration + (workingPeriods[cal_idx][minTime] - workingPeriods[cal_idx][end]);
		}
		return start;
	}